

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O3

int __thiscall
ddd::DictionaryMLT<false,_false>::stat(DictionaryMLT<false,_false> *this,char *__file,stat *__buf)

{
  uint uVar1;
  DaTrie<false,_false,_true> *pDVar2;
  pointer pBVar3;
  pointer puVar4;
  __uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  _Var5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  pointer pcVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  
  *(size_t *)__file = this->num_keys_;
  __file[8] = '\x01';
  __file[9] = '\0';
  __file[10] = '\0';
  __file[0xb] = '\0';
  __file[0xc] = '\0';
  __file[0xd] = '\0';
  __file[0xe] = '\0';
  __file[0xf] = '\0';
  pDVar2 = (this->prefix_subtrie_)._M_t.
           super___uniq_ptr_impl<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_true>_*,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
           .super__Head_base<0UL,_ddd::DaTrie<false,_false,_true>_*,_false>._M_head_impl;
  lVar14 = *(long *)&(pDVar2->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>;
  pBVar3 = *(pointer *)
            ((long)&(pDVar2->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> + 8);
  uVar11 = (ulong)((long)pBVar3 - lVar14) >> 3;
  uVar16 = (ulong)pDVar2->bc_emps_;
  local_48 = uVar11 & 0xffffffff;
  local_58 = (ulong)((int)uVar11 - pDVar2->bc_emps_);
  *(ulong *)(__file + 0x10) = local_58;
  *(ulong *)(__file + 0x18) = local_48;
  local_50 = (ulong)((long)*(pointer *)
                            ((long)&(pDVar2->bc_).
                                    super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> + 0x10) -
                    lVar14) >> 3 & 0xffffffff;
  *(ulong *)(__file + 0x20) = local_50;
  *(ulong *)(__file + 0x28) = uVar16;
  lVar12 = *(long *)&(pDVar2->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl;
  pcVar10 = *(pointer *)((long)&(pDVar2->tail_).super__Vector_base<char,_std::allocator<char>_> + 8)
  ;
  iVar13 = (int)lVar12;
  uVar18 = (ulong)(uint)((int)pcVar10 - iVar13);
  *(ulong *)(__file + 0x30) = uVar18;
  uVar17 = (ulong)(uint)(*(int *)((long)&(pDVar2->tail_).
                                         super__Vector_base<char,_std::allocator<char>_> + 0x10) -
                        iVar13);
  *(ulong *)(__file + 0x38) = uVar17;
  uVar11 = (ulong)pDVar2->tail_emps_;
  *(ulong *)(__file + 0x40) = uVar11;
  pcVar10 = pcVar10 + (long)&pBVar3->field_0x0 +
            (long)*(pointer *)
                   ((long)&(pDVar2->blocks_).
                           super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_> + 8) +
            (long)*(pointer *)
                   ((long)&(pDVar2->node_links_).
                           super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> + 8) +
            (0x2c - (lVar14 + lVar12 +
                     *(long *)&(pDVar2->blocks_).
                               super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl +
                    *(long *)&(pDVar2->node_links_).
                              super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
                              _M_impl));
  puVar4 = (this->suffix_subtries_).
           super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar14 = (long)(this->suffix_subtries_).
                 super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
  if (lVar14 != 0) {
    lVar14 = lVar14 >> 3;
    lVar12 = 1;
    lVar19 = 0;
    do {
      _Var5._M_t.
      super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
      .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl =
           puVar4[lVar19]._M_t.
           super___uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
           ._M_t;
      if ((_Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
           )_Var5._M_t.
            super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
            .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl !=
          (DaTrie<false,_false,_false> *)0x0) {
        lVar6 = *(long *)_Var5._M_t.
                         super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                         .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                         _M_head_impl;
        lVar7 = *(long *)((long)_Var5._M_t.
                                super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                                _M_head_impl + 8);
        uVar15 = (ulong)(lVar7 - lVar6) >> 3;
        uVar1 = *(uint *)((long)_Var5._M_t.
                                super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                                _M_head_impl + 100);
        local_58 = local_58 + ((int)uVar15 - uVar1);
        *(ulong *)(__file + 0x10) = local_58;
        local_48 = local_48 + (uVar15 & 0xffffffff);
        *(ulong *)(__file + 0x18) = local_48;
        local_50 = local_50 +
                   ((ulong)(*(long *)((long)_Var5._M_t.
                                            super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                            .
                                            super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>
                                            ._M_head_impl + 0x10) - lVar6) >> 3 & 0xffffffff);
        *(ulong *)(__file + 0x20) = local_50;
        uVar16 = uVar16 + uVar1;
        *(ulong *)(__file + 0x28) = uVar16;
        lVar8 = *(long *)((long)_Var5._M_t.
                                super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                                _M_head_impl + 0x18);
        lVar9 = *(long *)((long)_Var5._M_t.
                                super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                                _M_head_impl + 0x20);
        iVar13 = (int)lVar8;
        uVar18 = uVar18 + (uint)((int)lVar9 - iVar13);
        *(ulong *)(__file + 0x30) = uVar18;
        uVar17 = uVar17 + (uint)(*(int *)((long)_Var5._M_t.
                                                super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                                .
                                                super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>
                                                ._M_head_impl + 0x28) - iVar13);
        *(ulong *)(__file + 0x38) = uVar17;
        uVar11 = uVar11 + *(uint *)((long)_Var5._M_t.
                                          super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                          .
                                          super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>
                                          ._M_head_impl + 0x68);
        *(ulong *)(__file + 0x40) = uVar11;
        pcVar10 = pcVar10 + ((lVar7 + lVar9 +
                              *(long *)((long)_Var5._M_t.
                                              super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                              .
                                              super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>
                                              ._M_head_impl + 0x38) +
                             *(long *)((long)_Var5._M_t.
                                             super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                             .
                                             super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>
                                             ._M_head_impl + 0x50)) -
                            (lVar6 + lVar8 +
                             *(long *)((long)_Var5._M_t.
                                             super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                             .
                                             super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>
                                             ._M_head_impl + 0x30) +
                            *(long *)((long)_Var5._M_t.
                                            super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                            .
                                            super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>
                                            ._M_head_impl + 0x48))) + 0x2c;
        lVar12 = lVar12 + 1;
        *(long *)(__file + 8) = lVar12;
      }
      pcVar10 = pcVar10 + 1;
      lVar19 = lVar19 + 1;
    } while (lVar14 + (ulong)(lVar14 == 0) != lVar19);
  }
  *(pointer *)(__file + 0x48) = pcVar10 + 0x14;
  return (int)(pcVar10 + 0x14);
}

Assistant:

void stat(Stat& ret) const {
    ret.num_keys = num_keys_;
    ret.num_tries = 1;
    ret.num_nodes = prefix_subtrie_->num_nodes();
    ret.bc_size = prefix_subtrie_->bc_size();
    ret.bc_capa = prefix_subtrie_->bc_capa();
    ret.bc_emps = prefix_subtrie_->bc_emps();
    ret.tail_size = prefix_subtrie_->tail_size();
    ret.tail_capa = prefix_subtrie_->tail_capa();
    ret.tail_emps = prefix_subtrie_->tail_emps();
    ret.size_in_bytes = prefix_subtrie_->size_in_bytes();

    for (size_t i = 0; i < suffix_subtries_.size(); ++i) {
      auto& subtrie = suffix_subtries_[i];
      if (subtrie) {
        ret.num_nodes += subtrie->num_nodes();
        ret.bc_size += subtrie->bc_size();
        ret.bc_capa += subtrie->bc_capa();
        ret.bc_emps += subtrie->bc_emps();
        ret.tail_size += subtrie->tail_size();
        ret.tail_capa += subtrie->tail_capa();
        ret.tail_emps += subtrie->tail_emps();
        ret.size_in_bytes += subtrie->size_in_bytes();
        ++ret.num_tries;
      }
      ret.size_in_bytes += sizeof(bool);
    }

    ret.size_in_bytes += sizeof(suffix_subtries_.size());
    ret.size_in_bytes += sizeof(suffix_head_);
    ret.size_in_bytes += sizeof(num_keys_);
  }